

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataflow.cpp
# Opt level: O1

BinaryOp * __thiscall nwcpp::Dataflow::CreateBinaryOp(Dataflow *this,char op,Node *lhs,Node *rhs)

{
  _Head_base<0UL,_nwcpp::Node_*,_false> this_00;
  __uniq_ptr_impl<nwcpp::Node,_std::default_delete<nwcpp::Node>_> local_30;
  
  this_00._M_head_impl = (Node *)operator_new(0x28);
  BinaryOp::BinaryOp((BinaryOp *)this_00._M_head_impl,(Passkey)this,op,lhs,rhs);
  local_30._M_t.super__Tuple_impl<0UL,_nwcpp::Node_*,_std::default_delete<nwcpp::Node>_>.
  super__Head_base<0UL,_nwcpp::Node_*,_false>._M_head_impl =
       (tuple<nwcpp::Node_*,_std::default_delete<nwcpp::Node>_>)
       (tuple<nwcpp::Node_*,_std::default_delete<nwcpp::Node>_>)this_00._M_head_impl;
  std::
  vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
  ::emplace_back<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>
            ((vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
              *)&this->nodes_,
             (unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_> *)&local_30);
  if ((_Tuple_impl<0UL,_nwcpp::Node_*,_std::default_delete<nwcpp::Node>_>)
      local_30._M_t.super__Tuple_impl<0UL,_nwcpp::Node_*,_std::default_delete<nwcpp::Node>_>.
      super__Head_base<0UL,_nwcpp::Node_*,_false>._M_head_impl != (Node *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_nwcpp::Node_*,_std::default_delete<nwcpp::Node>_>.
                          super__Head_base<0UL,_nwcpp::Node_*,_false>._M_head_impl + 8))();
  }
  return (BinaryOp *)(_Head_base<0UL,_nwcpp::Node_*,_false>)this_00._M_head_impl;
}

Assistant:

BinaryOp* Dataflow::CreateBinaryOp(char op, const Node* lhs, const Node* rhs) {
  Passkey passkey(this);
  auto operation = std::make_unique<BinaryOp>(passkey, op, lhs, rhs);
  const auto ptr = operation.get();
  nodes_.push_back(std::move(operation));
  return ptr;
}